

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ArraySpeciesCreate(JSContext *ctx,JSValue obj,JSValue len_val)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue func_obj;
  JSValue op2;
  JSValue op1;
  JSValue func_obj_00;
  JSValue new_target;
  JSValue v_02;
  JSValue new_target_00;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  long lVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  JSContext *pJVar5;
  JSContext *in_RDI;
  JSValue JVar6;
  JSContext *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  undefined1 in_stack_00000018 [16];
  JSContext *realm;
  int res;
  JSValue species;
  JSValue ret;
  JSValue ctor;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  JSContext *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  JSContext *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  JSContext *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  int64_t in_stack_fffffffffffffee0;
  JSValueUnion in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  JSValue *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  int argc;
  uint in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  int64_t in_stack_ffffffffffffff40;
  JSValueUnion local_a8;
  int64_t local_a0;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_10;
  JSAtom prop;
  
  argc = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  JVar6.tag._0_4_ = in_stack_fffffffffffffeb8;
  JVar6.u = (JSValueUnion)in_stack_fffffffffffffeb0;
  JVar6.tag._4_4_ = in_stack_fffffffffffffebc;
  iVar2 = JS_IsArray((JSContext *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     JVar6);
  lVar1 = local_70;
  if (iVar2 < 0) {
    local_70.ptr = (void *)(lVar1 << 0x20);
    local_68 = 6;
  }
  else if (iVar2 == 0) {
    new_target.tag = in_stack_ffffffffffffff40;
    new_target.u.float64 = in_stack_ffffffffffffff38.float64;
    _local_70 = js_array_constructor
                          ((JSContext *)(ulong)in_stack_ffffffffffffff30,new_target,argc,
                           (JSValue *)0x3);
  }
  else {
    _local_70 = JS_GetPropertyInternal
                          (unaff_retaddr,(JSValue)in_stack_00000018,prop,(JSValue)in_stack_00000008,
                           ret.u.int32);
    local_10 = local_70;
    local_a0 = local_70;
    local_a8 = local_10;
    iVar3 = JS_IsException(_local_70);
    if (iVar3 == 0) {
      iVar3 = JS_IsConstructor(in_RDI,_local_70);
      if (iVar3 != 0) {
        func_obj_00.tag._0_4_ = in_stack_fffffffffffffef8;
        func_obj_00.u.ptr = (void *)in_stack_fffffffffffffef0;
        func_obj_00.tag._4_4_ = in_stack_fffffffffffffefc;
        pJVar5 = JS_GetFunctionRealm((JSContext *)in_stack_fffffffffffffee8.ptr,func_obj_00);
        if (pJVar5 == (JSContext *)0x0) {
          v.u._4_4_ = in_stack_fffffffffffffebc;
          v.u.int32 = in_stack_fffffffffffffeb8;
          v.tag = (int64_t)in_stack_fffffffffffffec0;
          JS_FreeValue(in_stack_fffffffffffffeb0,v);
          local_70.ptr = (void *)(lVar1 << 0x20);
          local_68 = 6;
          return _local_70;
        }
        if ((pJVar5 != in_RDI) &&
           (op1.tag = in_stack_fffffffffffffef0, op1.u.ptr = in_stack_fffffffffffffee8.ptr,
           op2.u._4_4_ = in_stack_fffffffffffffedc, op2.u.int32 = in_stack_fffffffffffffed8,
           op2.tag = in_stack_fffffffffffffee0,
           BVar4 = js_same_value(in_stack_fffffffffffffed0,op1,op2), BVar4 != 0)) {
          v_00.u._4_4_ = in_stack_fffffffffffffebc;
          v_00.u.int32 = in_stack_fffffffffffffeb8;
          v_00.tag = (int64_t)in_stack_fffffffffffffec0;
          JS_FreeValue(in_stack_fffffffffffffeb0,v_00);
          local_a8.ptr = (void *)((ulong)in_stack_fffffffffffffefc << 0x20);
          local_a0 = 3;
        }
        argc = (int)((ulong)pJVar5 >> 0x20);
      }
      v_03.tag = local_a0;
      v_03.u.ptr = local_a8.ptr;
      iVar3 = JS_IsObject(v_03);
      if (iVar3 != 0) {
        prop = local_70._12_4_;
        JVar6 = JS_GetPropertyInternal
                          (unaff_retaddr,(JSValue)in_stack_00000018,prop,(JSValue)in_stack_00000008,
                           ret.u.int32);
        local_40 = JVar6.u;
        local_38 = JVar6.tag;
        v_01.u._4_4_ = in_stack_fffffffffffffebc;
        v_01.u.int32 = in_stack_fffffffffffffeb8;
        v_01.tag = (int64_t)in_stack_fffffffffffffec0;
        JS_FreeValue(in_stack_fffffffffffffeb0,v_01);
        v_02.tag = local_38;
        v_02.u.ptr = local_40.ptr;
        iVar3 = JS_IsException(v_02);
        if (iVar3 != 0) {
          local_68 = local_38;
          local_70.ptr = local_40.ptr;
          return _local_70;
        }
        v_04.tag = local_38;
        v_04.u.ptr = local_40.ptr;
        in_stack_ffffffffffffff38 = local_40;
        in_stack_ffffffffffffff40 = local_38;
        iVar3 = JS_IsNull(v_04);
        local_a8 = local_40;
        local_a0 = local_38;
        if (iVar3 != 0) {
          local_a8.ptr = (void *)((ulong)in_stack_fffffffffffffedc << 0x20);
          local_a0 = 3;
        }
      }
      v_05.tag = local_a0;
      v_05.u.ptr = local_a8.ptr;
      iVar3 = JS_IsUndefined(v_05);
      if (iVar3 == 0) {
        func_obj.u._4_4_ = in_stack_fffffffffffffecc;
        func_obj.u.int32 = in_stack_fffffffffffffec8;
        func_obj.tag = (int64_t)in_stack_fffffffffffffed0;
        _local_70 = JS_CallConstructor(in_stack_fffffffffffffec0,func_obj,in_stack_fffffffffffffebc,
                                       (JSValue *)in_stack_fffffffffffffeb0);
        JS_FreeValue(in_stack_fffffffffffffeb0,_local_70);
      }
      else {
        new_target_00.tag = in_stack_ffffffffffffff40;
        new_target_00.u.float64 = in_stack_ffffffffffffff38.float64;
        _local_70 = js_array_constructor
                              ((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffff30),new_target_00,
                               argc,in_stack_ffffffffffffff20);
      }
    }
  }
  return _local_70;
}

Assistant:

static JSValue JS_ArraySpeciesCreate(JSContext *ctx, JSValueConst obj,
                                     JSValueConst len_val)
{
    JSValue ctor, ret, species;
    int res;
    JSContext *realm;
    
    res = JS_IsArray(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res)
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    ctor = JS_GetProperty(ctx, obj, JS_ATOM_constructor);
    if (JS_IsException(ctor))
        return ctor;
    if (JS_IsConstructor(ctx, ctor)) {
        /* legacy web compatibility */
        realm = JS_GetFunctionRealm(ctx, ctor);
        if (!realm) {
            JS_FreeValue(ctx, ctor);
            return JS_EXCEPTION;
        }
        if (realm != ctx &&
            js_same_value(ctx, ctor, realm->array_ctor)) {
            JS_FreeValue(ctx, ctor);
            ctor = JS_UNDEFINED;
        }
    }
    if (JS_IsObject(ctor)) {
        species = JS_GetProperty(ctx, ctor, JS_ATOM_Symbol_species);
        JS_FreeValue(ctx, ctor);
        if (JS_IsException(species))
            return species;
        ctor = species;
        if (JS_IsNull(ctor))
            ctor = JS_UNDEFINED;
    }
    if (JS_IsUndefined(ctor)) {
        return js_array_constructor(ctx, JS_UNDEFINED, 1, &len_val);
    } else {
        ret = JS_CallConstructor(ctx, ctor, 1, &len_val);
        JS_FreeValue(ctx, ctor);
        return ret;
    }
}